

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O0

cmCMakePath * __thiscall
cmCMakePath::GetNarrowStem(cmCMakePath *__return_storage_ptr__,cmCMakePath *this)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined4 local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long local_78;
  size_type pos;
  path local_60;
  undefined1 local_38 [8];
  string stem;
  cmCMakePath *this_local;
  
  stem.field_2._8_8_ = this;
  std::filesystem::__cxx11::path::stem(&local_60,&this->Path);
  std::filesystem::__cxx11::path::string((string *)local_38,&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator[]((ulong)local_38);
    local_78 = std::__cxx11::string::find((char)local_38,0x2e);
    if (local_78 != -1) {
      std::__cxx11::string::substr((ulong)&local_98,(ulong)local_38);
      cmCMakePath<std::__cxx11::string,cmCMakePath&>
                (__return_storage_ptr__,&local_98,generic_format);
      std::__cxx11::string::~string((string *)&local_98);
      goto LAB_007286ba;
    }
  }
  std::__cxx11::string::string((string *)&local_c0,(string *)local_38);
  cmCMakePath<std::__cxx11::string,cmCMakePath&>(__return_storage_ptr__,&local_c0,generic_format);
  std::__cxx11::string::~string((string *)&local_c0);
LAB_007286ba:
  local_9c = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath cmCMakePath::GetNarrowStem() const
{
  auto stem = this->Path.stem().string();
  if (!stem.empty()) {
    auto pos = stem.find('.', stem[0] == '.' ? 1 : 0);
    if (pos != std::string::npos) {
      return stem.substr(0, pos);
    }
  }
  return stem;
}